

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O1

void LiteScript::Syntax::PopOperator
               (vector<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
                *op,vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>
                    *instrl)

{
  pointer *ppOVar1;
  Instruction IStack_28;
  
  switch((op->
         super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
         )._M_impl.super__Vector_impl_data._M_finish[-1]) {
  case OP_POST_INCR:
    Instruction::Instruction(&IStack_28,INSTR_OP_POST_INCR);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_POST_DECR:
    Instruction::Instruction(&IStack_28,INSTR_OP_POST_DECR);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_CALL:
    Instruction::Instruction(&IStack_28,INSTR_OP_CALL);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_GET:
    Instruction::Instruction(&IStack_28,INSTR_OP_ARRAY);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_MEMBER:
    (instrl->super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>).
    _M_impl.super__Vector_impl_data._M_finish[-1].code = '9';
    goto switchD_0013804d_default;
  case OP_PRE_INCR:
    Instruction::Instruction(&IStack_28,INSTR_OP_PRE_INCR);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_PRE_DECR:
    Instruction::Instruction(&IStack_28,INSTR_OP_PRE_DECR);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_UNARY_PLUS:
    Instruction::Instruction(&IStack_28,INSTR_OP_UNARY_PLUS);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_UNARY_MINUS:
    Instruction::Instruction(&IStack_28,INSTR_OP_UNARY_MINUS);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_NOT:
    Instruction::Instruction(&IStack_28,INSTR_OP_LOG_NOT);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_BIT_NOT:
    Instruction::Instruction(&IStack_28,INSTR_OP_BIT_NOT);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_NEW:
    Instruction::Instruction(&IStack_28,INSTR_VALUE_OBJECT);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_MUL:
    Instruction::Instruction(&IStack_28,INSTR_OP_MUL);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_DIV:
    Instruction::Instruction(&IStack_28,INSTR_OP_DIV);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_MOD:
    Instruction::Instruction(&IStack_28,INSTR_OP_MOD);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_ADD:
    Instruction::Instruction(&IStack_28,INSTR_OP_ADD);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_SUB:
    Instruction::Instruction(&IStack_28,INSTR_OP_SUB);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_LSHIFT:
    Instruction::Instruction(&IStack_28,INSTR_OP_LSHIFT);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_RSHIFT:
    Instruction::Instruction(&IStack_28,INSTR_OP_RSHIFT);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_LESS:
    Instruction::Instruction(&IStack_28,INSTR_OP_LESS);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_LESS_EQU:
    Instruction::Instruction(&IStack_28,INSTR_OP_LESS_EQU);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_GREAT:
    Instruction::Instruction(&IStack_28,INSTR_OP_GREAT);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_GREAT_EQU:
    Instruction::Instruction(&IStack_28,INSTR_OP_GREAT_EQU);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_EQU:
    Instruction::Instruction(&IStack_28,INSTR_OP_EQU);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_DIF:
    Instruction::Instruction(&IStack_28,INSTR_OP_DIF);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_BIT_AND:
    Instruction::Instruction(&IStack_28,INSTR_OP_BIT_AND);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_BIT_XOR:
    Instruction::Instruction(&IStack_28,INSTR_OP_BIT_XOR);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_BIT_OR:
    Instruction::Instruction(&IStack_28,INSTR_OP_BIT_OR);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_AND:
    Instruction::Instruction(&IStack_28,INSTR_OP_LOG_AND);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_OR:
    Instruction::Instruction(&IStack_28,INSTR_OP_LOG_OR);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_ASSIGN:
    Instruction::Instruction(&IStack_28,INSTR_OP_ASSIGN);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_ADD_ASSIGN:
    Instruction::Instruction(&IStack_28,INSTR_OP_ADD_ASSIGN);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_SUB_ASSIGN:
    Instruction::Instruction(&IStack_28,INSTR_OP_SUB_ASSIGN);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_MUL_ASSIGN:
    Instruction::Instruction(&IStack_28,INSTR_OP_MUL_ASSIGN);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  case OP_DIV_ASSIGN:
    Instruction::Instruction(&IStack_28,INSTR_OP_DIV_ASSIGN);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
    emplace_back<LiteScript::Instruction>(instrl,&IStack_28);
    break;
  default:
    goto switchD_0013804d_default;
  }
  Instruction::~Instruction(&IStack_28);
switchD_0013804d_default:
  ppOVar1 = &(op->
             super__Vector_base<LiteScript::Syntax::Operators,_std::allocator<LiteScript::Syntax::Operators>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  *ppOVar1 = *ppOVar1 + -1;
  return;
}

Assistant:

void LiteScript::Syntax::PopOperator(std::vector<Operators> &op, std::vector<Instruction>& instrl) {
    switch (op.back()) {
        // LEVEL 1
        case Operators::OP_POST_INCR:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_POST_INCR));
            break;
        case Operators::OP_POST_DECR:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_POST_DECR));
            break;
        case Operators::OP_CALL:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_CALL));
            break;
        case Operators::OP_GET:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_ARRAY));
            break;
        case Operators::OP_MEMBER:
            instrl.back().code = InstrCode::INSTR_OP_MEMBER;
            break;
        // LEVEL 2
        case Operators::OP_PRE_INCR:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_PRE_INCR));
            break;
        case Operators::OP_PRE_DECR:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_PRE_DECR));
            break;
        case Operators::OP_UNARY_PLUS:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_UNARY_PLUS));
            break;
        case Operators::OP_UNARY_MINUS:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_UNARY_MINUS));
            break;
        case Operators::OP_NOT:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_LOG_NOT));
            break;
        case Operators::OP_BIT_NOT:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_BIT_NOT));
            break;
        case Operators::OP_NEW:
            instrl.push_back(Instruction(InstrCode::INSTR_VALUE_OBJECT));
            break;
        // LEVEL 3
        case Operators::OP_MUL:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_MUL));
            break;
        case Operators::OP_DIV:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_DIV));
            break;
        case Operators::OP_MOD:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_MOD));
            break;
        // LEVEL 4
        case Operators::OP_ADD:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_ADD));
            break;
        case Operators::OP_SUB:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_SUB));
            break;
        // LEVEL 5
        case Operators::OP_LSHIFT:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_LSHIFT));
            break;
        case Operators::OP_RSHIFT:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_RSHIFT));
            break;
        // LEVEL 6
        case Operators::OP_LESS:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_LESS));
            break;
        case Operators::OP_LESS_EQU:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_LESS_EQU));
            break;
        case Operators::OP_GREAT:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_GREAT));
            break;
        case Operators::OP_GREAT_EQU:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_GREAT_EQU));
            break;
        // LEVEL 7
        case Operators::OP_EQU:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_EQU));
            break;
        case Operators::OP_DIF:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_DIF));
            break;
        // LEVEL 8
        case Operators::OP_BIT_AND:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_BIT_AND));
            break;
        // LEVEL 9
        case Operators::OP_BIT_XOR:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_BIT_XOR));
            break;
        // LEVEL 10
        case Operators::OP_BIT_OR:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_BIT_OR));
            break;
        // LEVEL 11
        case Operators::OP_AND:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_LOG_AND));
            break;
        // LEVEL 12
        case Operators::OP_OR:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_LOG_OR));
            break;
        // LEVEL 13
        case Operators::OP_ASSIGN:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_ASSIGN));
            break;
        case Operators::OP_ADD_ASSIGN:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_ADD_ASSIGN));
            break;
        case Operators::OP_SUB_ASSIGN:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_SUB_ASSIGN));
            break;
        case Operators::OP_MUL_ASSIGN:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_MUL_ASSIGN));
            break;
        case Operators::OP_DIV_ASSIGN:
            instrl.push_back(Instruction(InstrCode::INSTR_OP_DIV_ASSIGN));
            break;
        default:
            break;
    }
    op.pop_back();
}